

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeparser.cpp
# Opt level: O0

void __thiscall
NodeParser::parseInitQual
          (NodeParser *this,Node *node,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  bool bVar1;
  size_type sVar2;
  InputError *pIVar3;
  string local_88 [32];
  pointer local_68;
  double x;
  string *tokens;
  allocator local_41;
  string local_40 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokenList_local;
  Node *node_local;
  NodeParser *this_local;
  
  local_20 = tokenList;
  tokenList_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)node;
  node_local = (Node *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(tokenList);
  if (sVar2 < 2) {
    tokens._3_1_ = 1;
    pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"",&local_41);
    InputError::InputError(pIVar3,2,(string *)local_40);
    tokens._3_1_ = 0;
    __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
  }
  x = (double)std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](local_20,0);
  bVar1 = Utilities::parseNumber<double>((string *)((long)x + 0x20),(double *)&local_68);
  if ((bVar1) && (0.0 <= (double)local_68)) {
    tokenList_local[3].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_68;
    return;
  }
  pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string(local_88,(string *)((long)x + 0x20));
  InputError::InputError(pIVar3,6,(string *)local_88);
  __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
}

Assistant:

void NodeParser::parseInitQual(Node* node, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - node ID
    // 1 - initial quality concentration

    if ( tokenList.size() < 2 ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string* tokens = &tokenList[0];

    double x;
    if ( !Utilities::parseNumber(tokens[1], x) || x < 0.0)
    {
        throw InputError(InputError::INVALID_NUMBER, tokens[1]);
    }
    node->initQual = x;
}